

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> __thiscall
iDynTree::optimalcontrol::integrators::Integrator::dynamicalSystem(Integrator *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_RSI;
  element_type *in_RDI;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar1;
  
  std::weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>::
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,void>
            (in_RSI,(shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)in_RDI);
  wVar1.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  wVar1.super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (weak_ptr<iDynTree::optimalcontrol::DynamicalSystem>)
         wVar1.
         super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::weak_ptr<DynamicalSystem> Integrator::dynamicalSystem() const{
                return m_dynamicalSystem_ptr;
            }